

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O3

GLFWgammaramp * glfwGetGammaRamp(GLFWmonitor *handle)

{
  GLFWgammaramp *ramp;
  
  if (handle != (GLFWmonitor *)0x0) {
    if (_glfwInitialized == 0) {
      ramp = (GLFWgammaramp *)0x0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      ramp = (GLFWgammaramp *)(handle + 0x60);
      _glfwFreeGammaArrays(ramp);
      _glfwPlatformGetGammaRamp((_GLFWmonitor *)handle,ramp);
    }
    return ramp;
  }
  __assert_fail("monitor != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/glfw/src/monitor.c"
                ,0x1bb,"const GLFWgammaramp *glfwGetGammaRamp(GLFWmonitor *)");
}

Assistant:

GLFWAPI const GLFWgammaramp* glfwGetGammaRamp(GLFWmonitor* handle)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    _glfwFreeGammaArrays(&monitor->currentRamp);
    _glfwPlatformGetGammaRamp(monitor, &monitor->currentRamp);

    return &monitor->currentRamp;
}